

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-make.c
# Opt level: O2

void object_prep(object *obj,object_kind *k,wchar_t lev,aspect rand_aspect)

{
  bitflag *flags1;
  byte bVar1;
  object_base_conflict *poVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  _Bool _Var6;
  int iVar7;
  long lVar8;
  random_value v;
  
  memset(&obj->ego,0,0x140);
  obj->kind = k;
  obj->tval = (uint8_t)k->tval;
  obj->sval = (uint8_t)k->sval;
  obj->ac = (int16_t)k->ac;
  obj->dd = (uint8_t)k->dd;
  obj->ds = (uint8_t)k->ds;
  obj->weight = (int16_t)k->weight;
  obj->effect = k->effect;
  obj->activation = k->activation;
  wVar3 = (k->time).dice;
  wVar4 = (k->time).sides;
  wVar5 = (k->time).m_bonus;
  (obj->time).base = (k->time).base;
  (obj->time).dice = wVar3;
  (obj->time).sides = wVar4;
  (obj->time).m_bonus = wVar5;
  obj->number = '\x01';
  flags1 = obj->flags;
  flag_copy(flags1,k->base->flags,6);
  flag_copy(flags1,k->flags,6);
  for (lVar8 = 0; lVar8 != 0x22; lVar8 = lVar8 + 2) {
    v._8_8_ = *(undefined8 *)(&k->modifiers[0].sides + lVar8 * 2);
    v._0_8_ = *(undefined8 *)(&k->modifiers[0].base + lVar8 * 2);
    iVar7 = randcalc(v,lev,rand_aspect);
    *(short *)((long)obj->modifiers + lVar8) = (short)iVar7;
  }
  _Var6 = tval_can_have_charges(obj);
  if (_Var6) {
    iVar7 = randcalc((random_value)k->charge,lev,rand_aspect);
    obj->pval = (int16_t)iVar7;
  }
  _Var6 = tval_is_edible(obj);
  if (_Var6) {
LAB_0019e2c3:
    iVar7 = randcalc((random_value)k->pval,lev,rand_aspect);
    obj->pval = (int16_t)iVar7;
  }
  else {
    _Var6 = tval_is_potion(obj);
    if (_Var6) goto LAB_0019e2c3;
    _Var6 = tval_is_fuel(obj);
    if (_Var6) goto LAB_0019e2c3;
    _Var6 = tval_is_launcher(obj);
    if (_Var6) goto LAB_0019e2c3;
  }
  _Var6 = tval_is_light(obj);
  if (_Var6) {
    _Var6 = flag_has_dbg(flags1,6,0x17,"obj->flags","OF_BURNS_OUT");
    lVar8 = 0x92;
    if (!_Var6) {
      _Var6 = flag_has_dbg(flags1,6,0x18,"obj->flags","OF_TAKES_FUEL");
      lVar8 = 0x96;
      if (!_Var6) goto LAB_0019e348;
    }
    obj->timeout = *(int16_t *)((long)&z_info->f_max + lVar8);
  }
LAB_0019e348:
  iVar7 = randcalc((random_value)k->to_h,lev,rand_aspect);
  obj->to_h = (int16_t)iVar7;
  iVar7 = randcalc((random_value)k->to_d,lev,rand_aspect);
  obj->to_d = (int16_t)iVar7;
  iVar7 = randcalc((random_value)k->to_a,lev,rand_aspect);
  obj->to_a = (int16_t)iVar7;
  copy_slays(&obj->slays,k->slays);
  copy_brands(&obj->brands,k->brands);
  copy_curses(obj,k->curses);
  poVar2 = k->base;
  for (lVar8 = 0; lVar8 != 0x1c; lVar8 = lVar8 + 1) {
    obj->el_info[lVar8].res_level = k->el_info[lVar8].res_level;
    bVar1 = k->el_info[lVar8].flags;
    obj->el_info[lVar8].flags = bVar1;
    obj->el_info[lVar8].flags = bVar1 | poVar2->el_info[lVar8].flags;
  }
  return;
}

Assistant:

void object_prep(struct object *obj, struct object_kind *k, int lev,
				 aspect rand_aspect)
{
	int i;

	/* Clean slate */
	memset(obj, 0, sizeof(*obj));

	/* Assign the kind and copy across data */
	obj->kind = k;
	obj->tval = k->tval;
	obj->sval = k->sval;
	obj->ac = k->ac;
	obj->dd = k->dd;
	obj->ds = k->ds;
	obj->weight = k->weight;
	obj->effect = k->effect;
	obj->activation = k->activation;
	obj->time = k->time;

	/* Default number */
	obj->number = 1;

	/* Copy flags */
	of_copy(obj->flags, k->base->flags);
	of_copy(obj->flags, k->flags);

	/* Assign modifiers */
	for (i = 0; i < OBJ_MOD_MAX; i++)
		obj->modifiers[i] = randcalc(k->modifiers[i], lev, rand_aspect);

	/* Assign charges (wands/staves only) */
	if (tval_can_have_charges(obj))
		obj->pval = randcalc(k->charge, lev, rand_aspect);

	/* Assign pval for food, oil and launchers */
	if (tval_is_edible(obj) || tval_is_potion(obj) || tval_is_fuel(obj) ||
		tval_is_launcher(obj))
		obj->pval
			= randcalc(k->pval, lev, rand_aspect);

	/* Default fuel */
	if (tval_is_light(obj)) {
		if (of_has(obj->flags, OF_BURNS_OUT))
			obj->timeout = z_info->fuel_torch;
		else if (of_has(obj->flags, OF_TAKES_FUEL))
			obj->timeout = z_info->default_lamp;
	}

	/* Default magic */
	obj->to_h = randcalc(k->to_h, lev, rand_aspect);
	obj->to_d = randcalc(k->to_d, lev, rand_aspect);
	obj->to_a = randcalc(k->to_a, lev, rand_aspect);

	/* Default slays, brands and curses */
	copy_slays(&obj->slays, k->slays);
	copy_brands(&obj->brands, k->brands);
	copy_curses(obj, k->curses);

	/* Default resists */
	for (i = 0; i < ELEM_MAX; i++) {
		obj->el_info[i].res_level = k->el_info[i].res_level;
		obj->el_info[i].flags = k->el_info[i].flags;
		obj->el_info[i].flags |= k->base->el_info[i].flags;
	}
}